

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O0

void capnp::compiler::anon_unknown_0::checkExampleValue
               (Reader *value,uint ordinal,Reader type,uint sharedOrdinalCount)

{
  int *__return_storage_ptr__;
  ReaderFor<double> RVar1;
  Reader type_00;
  Reader type_01;
  Field field_00;
  ReaderFor<signed_char> RVar2;
  ReaderFor<bool> RVar3;
  Which WVar4;
  ReaderFor<unsigned_short> RVar5;
  uint uVar6;
  ReaderFor<int> RVar7;
  ReaderFor<unsigned_int> RVar8;
  uint uVar9;
  uint uVar10;
  NullableValue<capnp::StructSchema::Field> *other;
  Field *pFVar11;
  NullableValue<capnp::EnumSchema::Enumerant> *pNVar12;
  Enumerant *pEVar13;
  bool bVar14;
  ReaderFor<capnp::DynamicEnum> RVar15;
  Fault local_5e0;
  Fault f_8;
  Reader local_5a8;
  ReaderFor<capnp::DynamicList> local_578;
  Reader local_538;
  Fault local_4f0;
  Fault f_7;
  EnumerantList local_4e0;
  Fault local_4a8;
  Schema local_4a0;
  uint16_t local_498;
  DynamicEnum local_490;
  Maybe<capnp::EnumSchema::Enumerant> local_480;
  undefined1 local_438 [8];
  NullableValue<capnp::EnumSchema::Enumerant> _kj_result;
  undefined1 local_3a8 [8];
  Enumerant enumerant;
  Reader local_338;
  Reader local_308;
  RawBrandedSchema *local_2d8;
  Schema SStack_2d0;
  uint local_2c8;
  undefined4 uStack_2c4;
  SegmentReader *pSStack_2c0;
  CapTableReader *local_2b8;
  void *pvStack_2b0;
  WirePointer *local_2a8;
  StructDataBitCount SStack_2a0;
  StructPointerCount SStack_29c;
  undefined2 uStack_29a;
  Reader local_298;
  ArrayPtr<const_char> local_250;
  undefined1 auStack_240 [8];
  Field field;
  Fault f_6;
  Reader local_1b8;
  ArrayPtr<const_char> local_170;
  Maybe<capnp::StructSchema::Field> local_160;
  undefined1 local_118 [8];
  NullableValue<capnp::StructSchema::Field> fieldI;
  StructSchema structType;
  ReaderFor<capnp::DynamicStruct> structValue;
  Fault f_5;
  StringPtr local_70;
  ArrayPtr<const_char> local_60;
  Fault local_50;
  Fault f_4;
  Fault f_3;
  Fault f_2;
  Fault f_1;
  Fault local_20;
  Fault f;
  uint sharedOrdinalCount_local;
  uint ordinal_local;
  Reader *value_local;
  
  f.exception._0_4_ = sharedOrdinalCount;
  f.exception._4_4_ = ordinal;
  WVar4 = capnp::schema::Type::Reader::which(&type);
  uVar6 = WVar4 - 1;
  if (0xe < uVar6 && WVar4 != 0x10) {
switchD_0020960b_caseD_20a01f:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37]>
              (&local_5e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
               ,0x226,FAILED,(char *)0x0,"\"You added a new possible field type!\"",
               (char (*) [37])"You added a new possible field type!");
    kj::_::Debug::Fault::fatal(&local_5e0);
  }
  switch((long)&switchD_0020960b::switchdataD_0031d07c +
         (long)(int)(&switchD_0020960b::switchdataD_0031d07c)[uVar6]) {
  case 0x20960d:
    RVar7 = DynamicValue::Reader::as<int>(value);
    if (RVar7 != f.exception._4_4_ * 0xb8df) {
      kj::_::Debug::Fault::Fault
                (&local_20,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x206,FAILED,"value.as<int32_t>() == ordinal * 47327","");
      kj::_::Debug::Fault::fatal(&local_20);
    }
    break;
  case 0x209679:
    RVar1 = DynamicValue::Reader::as<double>(value);
    if ((RVar1 != (double)f.exception._4_4_ * 313.25) ||
       (NAN(RVar1) || NAN((double)f.exception._4_4_ * 313.25))) {
      kj::_::Debug::Fault::Fault
                (&f_2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x207,FAILED,"value.as<double>() == ordinal * 313.25","");
      kj::_::Debug::Fault::fatal(&f_2);
    }
    break;
  case 0x2096f6:
    RVar2 = DynamicValue::Reader::as<signed_char>(value);
    if ((int)RVar2 != (f.exception._4_4_ & 0xff) - 0x80) {
      kj::_::Debug::Fault::Fault
                (&f_3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x208,FAILED,"value.as<int8_t>() == int(ordinal % 256) - 128","");
      kj::_::Debug::Fault::fatal(&f_3);
    }
    break;
  case 0x20976d:
    RVar5 = DynamicValue::Reader::as<unsigned_short>(value);
    if ((uint)RVar5 != f.exception._4_4_ * 0xd) {
      kj::_::Debug::Fault::Fault
                (&f_4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x209,FAILED,"value.as<uint16_t>() == ordinal * 13","");
      kj::_::Debug::Fault::fatal(&f_4);
    }
    break;
  case 0x2097d9:
    RVar3 = DynamicValue::Reader::as<bool>(value);
    if (RVar3 != ((f.exception._4_4_ & 1) == 0)) {
      kj::_::Debug::Fault::Fault
                (&local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x20a,FAILED,"value.as<bool>() == (ordinal % 2 == 0)","");
      kj::_::Debug::Fault::fatal(&local_50);
    }
    break;
  case 0x209855:
    local_60 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(value);
    kj::str<unsigned_int&>((String *)&f_5,(kj *)((long)&f.exception + 4),(uint *)local_60.size_);
    kj::StringPtr::StringPtr(&local_70,(String *)&f_5);
    bVar14 = kj::StringPtr::operator==((StringPtr *)&local_60,&local_70);
    kj::String::~String((String *)&f_5);
    if (!bVar14) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&structValue.reader.nestingLimit,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x20b,FAILED,"value.as<Text>() == kj::str(ordinal)","");
      kj::_::Debug::Fault::fatal((Fault *)&structValue.reader.nestingLimit);
    }
    break;
  case 0x20992f:
    DynamicValue::Reader::as<capnp::DynamicStruct>
              ((ReaderFor<capnp::DynamicStruct> *)&structType,value);
    fieldI.field_1._56_8_ =
         DynamicStruct::Reader::getSchema((ReaderFor<capnp::DynamicStruct> *)&structType);
    kj::StringPtr::StringPtr((StringPtr *)&local_170,"i");
    StructSchema::findFieldByName
              (&local_160,(StructSchema *)&fieldI.field_1.value.proto._reader.nestingLimit,
               (StringPtr)local_170);
    other = kj::_::readMaybe<capnp::StructSchema::Field>(&local_160);
    kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
              ((NullableValue<capnp::StructSchema::Field> *)local_118,other);
    kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_160);
    pFVar11 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_118);
    if (pFVar11 == (Field *)0x0) {
      kj::StringPtr::StringPtr((StringPtr *)&local_250,"f0");
      StructSchema::getFieldByName
                ((Field *)auStack_240,
                 (StructSchema *)&fieldI.field_1.value.proto._reader.nestingLimit,
                 (StringPtr)local_250);
      local_2a8 = field.proto._reader.pointers;
      SStack_2a0 = field.proto._reader.dataSize;
      SStack_29c = field.proto._reader.pointerCount;
      uStack_29a = field.proto._reader._38_2_;
      local_2b8 = field.proto._reader.capTable;
      pvStack_2b0 = field.proto._reader.data;
      local_2c8 = field.index;
      uStack_2c4 = field._12_4_;
      pSStack_2c0 = field.proto._reader.segment;
      local_2d8 = (RawBrandedSchema *)auStack_240;
      SStack_2d0 = field.parent.super_Schema.raw;
      field_00._8_8_ = field.parent.super_Schema.raw;
      field_00.parent.super_Schema.raw = (Schema)(Schema)auStack_240;
      field_00.proto._reader.segment = (SegmentReader *)field._8_8_;
      field_00.proto._reader.capTable = (CapTableReader *)field.proto._reader.segment;
      field_00.proto._reader.data = field.proto._reader.capTable;
      field_00.proto._reader.pointers = (WirePointer *)field.proto._reader.data;
      field_00.proto._reader._32_8_ = field.proto._reader.pointers;
      field_00.proto._reader.nestingLimit = field.proto._reader.dataSize;
      field_00.proto._reader._44_2_ = field.proto._reader.pointerCount;
      field_00.proto._reader._46_2_ = field.proto._reader._38_2_;
      DynamicStruct::Reader::get(&local_298,(Reader *)&structType,field_00);
      uVar9 = f.exception._4_4_;
      __return_storage_ptr__ = &enumerant.proto._reader.nestingLimit;
      StructSchema::Field::getProto((Reader *)__return_storage_ptr__,(Field *)auStack_240);
      capnp::schema::Field::Reader::getSlot(&local_338,(Reader *)__return_storage_ptr__);
      capnp::schema::Field::Slot::Reader::getType(&local_308,&local_338);
      type_00._reader.capTable = local_308._reader.capTable;
      type_00._reader.segment = local_308._reader.segment;
      type_00._reader.data = local_308._reader.data;
      type_00._reader.pointers = local_308._reader.pointers;
      type_00._reader.dataSize = local_308._reader.dataSize;
      type_00._reader.pointerCount = local_308._reader.pointerCount;
      type_00._reader._38_2_ = local_308._reader._38_2_;
      type_00._reader.nestingLimit = local_308._reader.nestingLimit;
      type_00._reader._44_4_ = local_308._reader._44_4_;
      checkExampleValue(&local_298,uVar9,type_00,(uint)f.exception);
      DynamicValue::Reader::~Reader(&local_298);
    }
    else {
      pFVar11 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                          ((NullableValue<capnp::StructSchema::Field> *)local_118);
      DynamicStruct::Reader::get(&local_1b8,(Reader *)&structType,*pFVar11);
      RVar8 = DynamicValue::Reader::as<unsigned_int>(&local_1b8);
      bVar14 = RVar8 != f.exception._4_4_;
      DynamicValue::Reader::~Reader(&local_1b8);
      if (bVar14) {
        kj::_::Debug::Fault::Fault
                  ((Fault *)&field.proto._reader.nestingLimit,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                   ,0x212,FAILED,"structValue.get(*fieldI).as<uint32_t>() == ordinal","");
        kj::_::Debug::Fault::fatal((Fault *)&field.proto._reader.nestingLimit);
      }
    }
    kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
              ((NullableValue<capnp::StructSchema::Field> *)local_118);
    break;
  case 0x209ccc:
    RVar15 = DynamicValue::Reader::as<capnp::DynamicEnum>(value);
    local_4a0.raw = (RawBrandedSchema *)RVar15.schema.super_Schema.raw;
    local_498 = RVar15.value;
    local_490.schema.super_Schema.raw = (Schema)(Schema)local_4a0.raw;
    local_490.value = local_498;
    DynamicEnum::getEnumerant(&local_480,&local_490);
    pNVar12 = kj::_::readMaybe<capnp::EnumSchema::Enumerant>(&local_480);
    kj::_::NullableValue<capnp::EnumSchema::Enumerant>::NullableValue
              ((NullableValue<capnp::EnumSchema::Enumerant> *)local_438,pNVar12);
    kj::Maybe<capnp::EnumSchema::Enumerant>::~Maybe(&local_480);
    pEVar13 = kj::_::NullableValue::operator_cast_to_Enumerant_((NullableValue *)local_438);
    if (pEVar13 == (Enumerant *)0x0) {
      kj::_::Debug::Fault::Fault
                (&local_4a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x21c,FAILED,"value.as<DynamicEnum>().getEnumerant() != nullptr","");
      kj::_::Debug::Fault::fatal(&local_4a8);
    }
    pNVar12 = kj::mv<kj::_::NullableValue<capnp::EnumSchema::Enumerant>>
                        ((NullableValue<capnp::EnumSchema::Enumerant> *)local_438);
    kj::_::NullableValue<capnp::EnumSchema::Enumerant>::NullableValue
              ((NullableValue<capnp::EnumSchema::Enumerant> *)
               &_kj_result.field_1.value.proto._reader.nestingLimit,pNVar12);
    kj::_::NullableValue<capnp::EnumSchema::Enumerant>::~NullableValue
              ((NullableValue<capnp::EnumSchema::Enumerant> *)local_438);
    pEVar13 = kj::_::NullableValue<capnp::EnumSchema::Enumerant>::operator*
                        ((NullableValue<capnp::EnumSchema::Enumerant> *)
                         &_kj_result.field_1.value.proto._reader.nestingLimit);
    memcpy(local_3a8,pEVar13,0x40);
    kj::_::NullableValue<capnp::EnumSchema::Enumerant>::~NullableValue
              ((NullableValue<capnp::EnumSchema::Enumerant> *)
               &_kj_result.field_1.value.proto._reader.nestingLimit);
    uVar9 = EnumSchema::Enumerant::getIndex((Enumerant *)local_3a8);
    uVar6 = f.exception._4_4_;
    f_7.exception = (Exception *)EnumSchema::Enumerant::getContainingEnum((Enumerant *)local_3a8);
    EnumSchema::getEnumerants(&local_4e0,(EnumSchema *)&f_7);
    uVar10 = EnumSchema::EnumerantList::size(&local_4e0);
    if (uVar9 != uVar6 % uVar10) {
      kj::_::Debug::Fault::Fault
                (&local_4f0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x21e,FAILED,
                 "enumerant.getIndex() == ordinal % enumerant.getContainingEnum().getEnumerants().size()"
                 ,"");
      kj::_::Debug::Fault::fatal(&local_4f0);
    }
    break;
  case 0x209f59:
    DynamicValue::Reader::as<capnp::DynamicList>(&local_578,value);
    DynamicList::Reader::operator[](&local_538,&local_578,0);
    uVar9 = f.exception._4_4_;
    capnp::schema::Type::Reader::getList((Reader *)&f_8,&type);
    capnp::schema::Type::List::Reader::getElementType(&local_5a8,(Reader *)&f_8);
    type_01._reader.capTable = local_5a8._reader.capTable;
    type_01._reader.segment = local_5a8._reader.segment;
    type_01._reader.data = local_5a8._reader.data;
    type_01._reader.pointers = local_5a8._reader.pointers;
    type_01._reader.dataSize = local_5a8._reader.dataSize;
    type_01._reader.pointerCount = local_5a8._reader.pointerCount;
    type_01._reader._38_2_ = local_5a8._reader._38_2_;
    type_01._reader.nestingLimit = local_5a8._reader.nestingLimit;
    type_01._reader._44_4_ = local_5a8._reader._44_4_;
    checkExampleValue(&local_538,uVar9,type_01,(uint)f.exception);
    DynamicValue::Reader::~Reader(&local_538);
    break;
  case 0x20a01f:
    goto switchD_0020960b_caseD_20a01f;
  }
  return;
}

Assistant:

void checkExampleValue(DynamicValue::Reader value, uint ordinal, schema::Type::Reader type,
                       uint sharedOrdinalCount) {
  switch (type.which()) {
    case schema::Type::INT32: KJ_ASSERT(value.as<int32_t>() == ordinal * 47327); break;
    case schema::Type::FLOAT64: KJ_ASSERT(value.as<double>() == ordinal * 313.25); break;
    case schema::Type::INT8: KJ_ASSERT(value.as<int8_t>() == int(ordinal % 256) - 128); break;
    case schema::Type::UINT16: KJ_ASSERT(value.as<uint16_t>() == ordinal * 13); break;
    case schema::Type::BOOL: KJ_ASSERT(value.as<bool>() == (ordinal % 2 == 0)); break;
    case schema::Type::TEXT: KJ_ASSERT(value.as<Text>() == kj::str(ordinal)); break;
    case schema::Type::STRUCT: {
      auto structValue = value.as<DynamicStruct>();
      auto structType = structValue.getSchema();

      KJ_IF_MAYBE(fieldI, structType.findFieldByName("i")) {
        // Type is "StructType"
        KJ_ASSERT(structValue.get(*fieldI).as<uint32_t>() == ordinal);
      } else {
        // Type is "Int32Struct" or the like.
        auto field = structType.getFieldByName("f0");
        checkExampleValue(structValue.get(field), ordinal,
                          field.getProto().getSlot().getType(), sharedOrdinalCount);
      }
      break;
    }
    case schema::Type::ENUM: {
      auto enumerant = KJ_ASSERT_NONNULL(value.as<DynamicEnum>().getEnumerant());
      KJ_ASSERT(enumerant.getIndex() ==
          ordinal % enumerant.getContainingEnum().getEnumerants().size());
      break;
    }
    case schema::Type::LIST:
      checkExampleValue(value.as<DynamicList>()[0], ordinal, type.getList().getElementType(),
                        sharedOrdinalCount);
      break;
    default:
      KJ_FAIL_ASSERT("You added a new possible field type!");
  }